

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void nn_hash_erase(nn_hash *self,nn_hash_item *item)

{
  uint32_t uVar1;
  
  uVar1 = nn_hash_key(item->key);
  nn_list_erase(self->array + (ulong)uVar1 % (ulong)self->slots,&item->list);
  self->items = self->items - 1;
  return;
}

Assistant:

void nn_hash_erase (struct nn_hash *self, struct nn_hash_item *item)
{
    uint32_t slot;

    slot = nn_hash_key (item->key) % self->slots;
    nn_list_erase (&self->array [slot], &item->list);
	--self->items;
}